

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

long __thiscall
duckdb::Interpolator<true>::Operation<long,long,duckdb::QuantileDirect<long>>
          (Interpolator<true> *this,long *v_t,Vector *result,QuantileDirect<long> *accessor)

{
  RESULT_TYPE_conflict2 input;
  long lVar1;
  
  input = InterpolateInternal<long,duckdb::QuantileDirect<long>>(this,v_t,accessor);
  lVar1 = Cast::Operation<long,long>(input);
  return lVar1;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}